

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkparts.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  fourcc_t fVar6;
  stream *psVar7;
  bool_t bVar8;
  ebml_element *Element;
  ebml_context *peVar9;
  filepos_t fVar10;
  ebml_element *Element_00;
  filepos_t fVar11;
  stream *psVar12;
  ulong *puVar13;
  char *pcVar14;
  int ErrCode;
  ebml_element *peVar15;
  array *p_00;
  textwriter *ptVar16;
  long lVar17;
  ulong uVar18;
  size_t j;
  int UpperElement;
  ebml_parser_context RContext;
  textwriter _StdErr;
  parsercontext p;
  tchar_t Ext [256];
  tchar_t Path [1024];
  tchar_t OutPath [1024];
  tchar_t String [1024];
  tchar_t Original [1024];
  int local_12fc;
  array local_12f8;
  char **local_12e8;
  ulong local_12e0;
  ebml_parser_context local_12d8;
  textwriter local_12b8;
  parsercontext local_1280;
  char local_1138 [256];
  ulong local_1038 [128];
  ulong local_c38;
  filepos_t local_c30;
  filepos_t local_c28;
  filepos_t local_c20;
  tchar_t local_838 [1024];
  char local_438 [1032];
  
  local_12e8 = argv;
  ParserContext_Init(&local_1280,(nodemeta *)0x0,(cc_memheap *)0x0,(cc_memheap *)0x0);
  (**(code **)((long)local_1280.Base.Base.Base.VMT + 0x40))(&local_1280,0x101,4,"Matroska");
  (**(code **)((long)local_1280.Base.Base.Base.VMT + 0x40))(&local_1280,0x102,4,"0.1.0");
  (**(code **)((long)local_1280.Base.Base.Base.VMT + 0x40))(&local_1280,0x100,4,"mkparts");
  MATROSKA_Init(&local_1280);
  local_12f8._Begin = (char *)0x0;
  local_12f8._Used = 0;
  StdErr = &local_12b8;
  local_12b8.Stream = (stream *)0x0;
  local_12b8.CC = (charconv *)0x0;
  local_12b8.SafeFormat = 0;
  local_12b8.Element = (tchar_t *)0x0;
  local_12b8.Deep = 0;
  local_12b8._36_4_ = 0;
  local_12b8.HasChild = 0;
  local_12b8.InsideContent = 0;
  psVar7 = (stream *)NodeSingleton(&local_1280,0x45445453);
  StdErr->Stream = psVar7;
  if (psVar7 == (stream *)0x0) {
    __assert_fail("StdErr->Stream!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/mkparts/mkparts.c"
                  ,0xac,"int main(int, const char **)");
  }
  if (argc < 2) {
    TextWrite((textwriter_conflict *)StdErr,
              "mkparts v0.1.0, Copyright (c) 2011-2020 Matroska Foundation\r\n");
LAB_00105a53:
    iVar5 = OutputError(1,"Usage: mkparts [options] <matroska_src>");
    TextWrite((textwriter_conflict *)StdErr,"Options:\r\n");
    TextWrite((textwriter_conflict *)StdErr,
              "  --split     split concatenated segments into different files\r\n");
    TextWrite((textwriter_conflict *)StdErr,"  --quiet     don\'t ouput progress and file info\r\n")
    ;
    TextWrite((textwriter_conflict *)StdErr,"  --version   show the version of mkparts\r\n");
    TextWrite((textwriter_conflict *)StdErr,"  --help      show this screen\r\n");
  }
  else {
    local_12e0 = (ulong)(argc - 1);
    uVar18 = 1;
    bVar2 = false;
    bVar4 = false;
    do {
      Node_FromStr(&local_1280,(tchar_t *)local_1038,0x400,local_12e8[uVar18]);
      bVar8 = tcsisame_ascii((tchar_t *)local_1038,"--split");
      bVar1 = bVar2;
      bVar3 = bVar4;
      if (bVar8 == 0) {
        bVar8 = tcsisame_ascii((tchar_t *)local_1038,"--version");
        bVar1 = true;
        if (bVar8 == 0) {
          bVar8 = tcsisame_ascii((tchar_t *)local_1038,"--quiet");
          if (bVar8 == 0) {
            bVar8 = tcsisame_ascii((tchar_t *)local_1038,"--help");
            bVar1 = true;
            bVar3 = true;
            if ((bVar8 == 0) && (bVar1 = bVar2, bVar3 = bVar4, uVar18 < local_12e0)) {
              TextPrintf((textwriter_conflict *)StdErr,"Unknown parameter \'%s\'\r\n",local_1038);
            }
          }
          else {
            Quiet = '\x01';
            bVar1 = bVar2;
          }
        }
      }
      uVar18 = uVar18 + 1;
      bVar2 = bVar1;
      bVar4 = bVar3;
    } while ((uint)argc != uVar18);
    if (bVar1) {
      TextWrite((textwriter_conflict *)StdErr,
                "mkparts v0.1.0, Copyright (c) 2011-2020 Matroska Foundation\r\n");
      if (bVar3) goto LAB_00105a53;
      iVar5 = 0;
    }
    else {
      Node_FromStr(&local_1280,(tchar_t *)local_1038,0x400,local_12e8[(ulong)(uint)argc - 1]);
      psVar7 = StreamOpen(&local_1280,(tchar_t *)local_1038,1);
      if (psVar7 != (stream *)0x0) {
        local_12d8.Context = MATROSKA_getContextStream();
        local_12d8.EndPosition = -1;
        local_12d8.UpContext = (ebml_parser_context *)0x0;
        local_12d8.Profile = -1;
        iVar5 = 0;
        psVar12 = psVar7;
        Element = EBML_FindNextElement(psVar7,&local_12d8,&local_12fc,0);
        ErrCode = (int)psVar12;
        if (Element != (ebml_element *)0x0) {
          iVar5 = 0;
          do {
            peVar9 = MATROSKA_getContextSegment();
            bVar8 = EBML_ElementIsType(Element,peVar9);
            if (bVar8 == 0) {
              peVar9 = EBML_getContextHead();
              bVar8 = EBML_ElementIsType(Element,peVar9);
              if (bVar8 == 0) {
                fVar6 = EBML_ElementClassID(Element);
                peVar15 = Element;
                fVar10 = EBML_ElementPosition(Element);
                OutputWarning((int)peVar15,"Unknown element %x at %ld in %s",(ulong)fVar6,fVar10,
                              local_1038);
                goto LAB_00105bb6;
              }
            }
            else {
              peVar15 = Element;
              fVar10 = EBML_ElementPosition(Element);
              OutputWarning((int)peVar15,"Matroska Segment at %ld in %s without an EBML header",
                            fVar10);
LAB_00105bb6:
              iVar5 = -3;
            }
            if (Quiet == '\0') {
              TextWrite((textwriter_conflict *)StdErr,".");
            }
            do {
              Element_00 = EBML_FindNextElement(psVar7,&local_12d8,&local_12fc,0);
              peVar9 = EBML_getContextHead();
              peVar15 = Element_00;
              bVar8 = EBML_ElementIsType(Element_00,peVar9);
              ErrCode = (int)peVar15;
              if (bVar8 != 0) {
                fVar10 = EBML_ElementPosition(Element_00);
                fVar11 = EBML_ElementPosition(Element);
                ErrCode = (int)Element;
                OutputWarning(ErrCode,
                              "Found a new EBML header at %ld instead of a segment after EBML Header at %ld in %s"
                              ,fVar10,fVar11,local_1038);
                iVar5 = -3;
                Element = Element_00;
              }
              if (Element_00 == (ebml_element *)0x0) goto LAB_00105dbd;
              peVar9 = MATROSKA_getContextSegment();
              bVar8 = EBML_ElementIsType(Element_00,peVar9);
            } while (bVar8 == 0);
            peVar9 = MATROSKA_getContextSegment();
            peVar15 = Element_00;
            bVar8 = EBML_ElementIsType(Element_00,peVar9);
            ErrCode = (int)peVar15;
            if ((bVar8 == 0) || (Element == (ebml_element *)0x0)) {
LAB_00105dbd:
              if (Element == (ebml_element *)0x0) {
                psVar12 = psVar7;
                Element = EBML_FindNextElement(psVar7,&local_12d8,&local_12fc,0);
                ErrCode = (int)psVar12;
              }
            }
            else {
              peVar9 = EBML_getContextHead();
              peVar15 = Element;
              bVar8 = EBML_ElementIsType(Element,peVar9);
              ErrCode = (int)peVar15;
              if (bVar8 != 0) {
                local_c38 = EBML_ElementPosition(Element);
                local_c28 = EBML_ElementPosition(Element_00);
                bVar8 = EBML_ElementIsFiniteSize(Element);
                if (bVar8 == 0) {
                  fVar10 = EBML_ElementPosition(Element_00);
                  local_c30 = EBML_ElementPosition(Element);
                  local_c30 = fVar10 - local_c30;
                }
                else {
                  local_c30 = EBML_ElementFullSize(Element,1);
                }
                NodeDelete((node *)Element);
                Element = EBML_ElementSkipData(Element_00,psVar7,&local_12d8,(ebml_element *)0x0,1);
                bVar8 = EBML_ElementIsFiniteSize(Element_00);
                if (bVar8 == 0) {
                  if (Element == (ebml_element *)0x0) {
                    local_c20 = (**(code **)((long)(psVar7->Base).VMT + 0x78))(psVar7,0,1);
                  }
                  else {
                    fVar10 = EBML_ElementPosition(Element);
                    local_c20 = EBML_ElementPosition(Element_00);
                    local_c20 = fVar10 - local_c20;
                  }
                }
                else {
                  local_c20 = EBML_ElementFullSize(Element_00,1);
                }
                NodeDelete((node *)Element_00);
                p_00 = &local_12f8;
                ArrayAppend(p_00,&local_c38,0x20,0);
                ErrCode = (int)p_00;
                goto LAB_00105dbd;
              }
            }
          } while (Element != (ebml_element *)0x0);
        }
        if (Quiet == '\0') {
          ptVar16 = StdErr;
          TextWrite((textwriter_conflict *)StdErr,"\r\n");
          ErrCode = (int)ptVar16;
        }
        if (local_12f8._Used < 0x20) {
          pcVar14 = "No segment found in %s";
          psVar12 = (stream *)0x0;
          puVar13 = local_1038;
          iVar5 = 3;
LAB_0010602f:
          iVar5 = OutputError(iVar5,pcVar14,puVar13);
        }
        else if ((local_12f8._Used & 0xffffffffffffffe0) == 0x20) {
          psVar12 = (stream *)0x0;
          OutputWarning(ErrCode,"Only one segment found in %s, do nothing",local_1038);
          iVar5 = -3;
        }
        else {
          lVar17 = 0x18;
          uVar18 = 0;
          do {
            pcVar14 = local_12f8._Begin;
            if (Quiet == '\0') {
              TextPrintf((textwriter_conflict *)StdErr,
                         "write segment %zu from %s %ld size %ld in %s\r\n",uVar18,local_1038,
                         *(undefined8 *)(local_12f8._Begin + lVar17 + -0x18),
                         *(long *)(local_12f8._Begin + lVar17) +
                         *(long *)(local_12f8._Begin + lVar17 + -0x10),local_1038);
            }
            SplitPath((tchar_t *)local_1038,local_438,0x400,local_838,0x400,local_1138,0x100);
            if (local_438[0] == '\0') {
              local_c38 = local_c38 & 0xffffffffffffff00;
            }
            else {
              tcscpy_s((tchar_t *)&local_c38,0x400,local_438);
              AddPathDelimiter((tchar_t *)&local_c38,0x400);
            }
            if (local_1138[0] == '\0') {
              stcatprintf_s((tchar_t *)&local_c38,0x400,"%zu.%s",uVar18,local_838);
            }
            else {
              stcatprintf_s((tchar_t *)&local_c38,0x400,"%s.%zu.%s",local_838,uVar18,local_1138);
            }
            psVar12 = StreamOpen(&local_1280,(tchar_t *)&local_c38,6);
            if (psVar12 == (stream *)0x0) {
              pcVar14 = "Could not open file \"%s\" for writing\r\n";
              puVar13 = &local_c38;
              iVar5 = 5;
              goto LAB_0010602f;
            }
            CopyTo(psVar7,psVar12,*(filepos_t *)(pcVar14 + lVar17 + -0x18),
                   *(filepos_t *)(pcVar14 + lVar17 + -0x10));
            CopyTo(psVar7,psVar12,*(filepos_t *)(pcVar14 + lVar17 + -8),
                   *(filepos_t *)(pcVar14 + lVar17));
            StreamClose(psVar12);
            uVar18 = uVar18 + 1;
            lVar17 = lVar17 + 0x20;
          } while (uVar18 < local_12f8._Used >> 5);
        }
        ArrayClear(&local_12f8);
        StreamClose(psVar7);
        if (psVar12 != (stream *)0x0) {
          StreamClose(psVar12);
        }
        goto LAB_00105ad1;
      }
      TextPrintf((textwriter_conflict *)StdErr,"Could not open file \"%s\" for reading\r\n",
                 local_1038);
      iVar5 = -2;
    }
  }
  ArrayClear(&local_12f8);
LAB_00105ad1:
  ParserContext_Done(&local_1280);
  return iVar5;
}

Assistant:

int main(int argc, const char *argv[])
{
    int Result = 0;
    int ShowUsage = 0;
    int ShowVersion = 0;
    parsercontext p;
    textwriter _StdErr;
    struct stream *Input = NULL, *Output = NULL;
    tchar_t Path[MAXPATHFULL];
    ebml_element *EbmlHead = NULL;
    ebml_parser_context RContext;
    int i,UpperElement;
    array SegmentStarts;

    // Core-C init phase
    ParserContext_Init(&p,NULL,NULL,NULL);
    Node_SetData(&p.Base.Base.Base,NODECONTEXT_PROJECT_VENDOR,TYPE_STRING,"Matroska");
    Node_SetData(&p.Base.Base.Base,NODECONTEXT_PROJECT_VERSION,TYPE_STRING,PROJECT_VERSION);
    Node_SetData(&p.Base.Base.Base,NODECONTEXT_PROJECT_NAME,TYPE_STRING,PROJECT_NAME);

    // EBML & Matroska Init
    MATROSKA_Init(&p);

    ArrayInit(&SegmentStarts);

    StdErr = &_StdErr;
    memset(StdErr,0,sizeof(_StdErr));
    StdErr->Stream = (struct stream*)NodeSingleton(&p,STDERR_ID);
    assert(StdErr->Stream!=NULL);

	for (i=1;i<argc;++i)
	{
	    Node_FromStr(&p,Path,TSIZEOF(Path),argv[i]);
		if (tcsisame_ascii(Path,T("--split"))) Split = 1;
		else if (tcsisame_ascii(Path,T("--version"))) ShowVersion = 1;
		else if (tcsisame_ascii(Path,T("--quiet"))) Quiet = 1;
        else if (tcsisame_ascii(Path,T("--help"))) {ShowVersion = 1; ShowUsage = 1;}
		else if (i<argc-1) TextPrintf(StdErr,T("Unknown parameter '%s'\r\n"),Path);
	}

    if (argc < 2 || ShowVersion)
    {
        TextWrite(StdErr,PROJECT_NAME T(" v") PROJECT_VERSION T(", Copyright (c) 2011-2020 Matroska Foundation\r\n"));
        if (argc < 2 || ShowUsage)
        {
            Result = OutputError(1,T("Usage: ") PROJECT_NAME T(" [options] <matroska_src>"));
		    TextWrite(StdErr,T("Options:\r\n"));
		    TextWrite(StdErr,T("  --split     split concatenated segments into different files\r\n"));
            TextWrite(StdErr,T("  --quiet     don't ouput progress and file info\r\n"));
            TextWrite(StdErr,T("  --version   show the version of ") PROJECT_NAME T("\r\n"));
            TextWrite(StdErr,T("  --help      show this screen\r\n"));
        }
        goto exit;
    }

    Node_FromStr(&p,Path,TSIZEOF(Path),argv[argc-1]);
    Input = StreamOpen(&p,Path,SFLAG_RDONLY/*|SFLAG_BUFFERED*/);
    if (!Input)
    {
        TextPrintf(StdErr,T("Could not open file \"%s\" for reading\r\n"),Path);
        Result = -2;
        goto exit;
    }

    if (!Split)
    {
        TextPrintf(StdErr,T("Only the --split option is supported for the moment\r\n"));
        Result = -3;
        goto exit;
    }

    // parse the source file to determine if it's a Matroska file and determine the location of the key parts
    RContext.Context = MATROSKA_getContextStream();
    RContext.EndPosition = INVALID_FILEPOS_T;
    RContext.UpContext = NULL;
    RContext.Profile = EBML_ANY_PROFILE;

    EbmlHead = EBML_FindNextElement(Input, &RContext, &UpperElement, 0);
    while (EbmlHead!=NULL)
    {
        // parse the list of EBML header+segment start points in memory
        ebml_element *Segment = NULL;

        if (EL_Type(EbmlHead, MATROSKA_getContextSegment()))
        {
            Result |= OutputWarning(3,T("Matroska Segment at %") TPRId64 T(" in %s without an EBML header"),EBML_ElementPosition(EbmlHead), Path);
            // TODO: if there is an existing EBML head before in the file, use it
            //       otherwise create an EBML head with best guess
        }
        else if (!EL_Type(EbmlHead, EBML_getContextHead()))
        {
            Result |= OutputWarning(3,T("Unknown element %x at %") TPRId64 T(" in %s"), EBML_ElementClassID(EbmlHead), EBML_ElementPosition(EbmlHead), Path);
            // TODO: if there is an existing EBML head before in the file, use it
            //       otherwise create an EBML head with best guess
        }

        if (!Quiet) TextWrite(StdErr,T("."));

        do {
            Segment = EBML_FindNextElement(Input, &RContext, &UpperElement, 0);
            if (EL_Type(Segment, EBML_getContextHead()))
            {
                Result |= OutputWarning(3,T("Found a new EBML header at %") TPRId64 T(" instead of a segment after EBML Header at %") TPRId64 T(" in %s"), EBML_ElementPosition(Segment), EBML_ElementPosition(EbmlHead), Path);
                EbmlHead = Segment;
            }
        } while (Segment!=NULL && !EL_Type(Segment, MATROSKA_getContextSegment()));

        if (Segment!=NULL && EL_Type(Segment, MATROSKA_getContextSegment()) && EbmlHead!=NULL && EL_Type(EbmlHead, EBML_getContextHead()))
        {
            SegmentStart currSegment;
            currSegment.EbmlHeadPos = EBML_ElementPosition(EbmlHead);
            currSegment.SegmentPos = EBML_ElementPosition(Segment);

            if (EBML_ElementIsFiniteSize(EbmlHead))
                currSegment.EbmlSize = EBML_ElementFullSize(EbmlHead, 1);
            else
                currSegment.EbmlSize = EBML_ElementPosition(Segment) - EBML_ElementPosition(EbmlHead); // TODO: we should write the proper size in the header if there is enough room
            NodeDelete((node*)EbmlHead);

            EbmlHead = EBML_ElementSkipData(Segment, Input, &RContext, NULL, 1);

            if (EBML_ElementIsFiniteSize(Segment))
                currSegment.SegmentSize = EBML_ElementFullSize(Segment, 1);
            else { // TODO: we should write the proper size in the segment if there is enough room
                if (EbmlHead!=NULL)
                    currSegment.SegmentSize = EBML_ElementPosition(EbmlHead) - EBML_ElementPosition(Segment);
                else
                    currSegment.SegmentSize = Stream_Seek(Input,0,SEEK_CUR);
            }
            NodeDelete((node*)Segment);

            ArrayAppend(&SegmentStarts, &currSegment, sizeof(currSegment), 0);
        }

        if (EbmlHead==NULL)
            EbmlHead = EBML_FindNextElement(Input, &RContext, &UpperElement, 0);
    }

    if (!Quiet) TextWrite(StdErr,T("\r\n"));

    if (ARRAYCOUNT(SegmentStarts, SegmentStart)==0)
        Result = OutputError(3,T("No segment found in %s"), Path);
    else if (ARRAYCOUNT(SegmentStarts, SegmentStart)==1)
        Result = OutputWarning(3,T("Only one segment found in %s, do nothing"), Path);
    else {
        tchar_t OutPath[MAXPATHFULL];
        tchar_t Original[MAXLINE], String[MAXLINE], Ext[MAXDATA];

        // TODO: copy each segment in a separate file
        for (size_t j=0; j<ARRAYCOUNT(SegmentStarts, SegmentStart); ++j)
        {
            SegmentStart *seg = ARRAYBEGIN(SegmentStarts, SegmentStart)+j;
            if (!Quiet) TextPrintf(StdErr,T("write segment %zu from %s %") TPRId64 T(" size %") TPRId64 T(" in %s\r\n"), j, Path, seg->EbmlHeadPos, seg->EbmlSize+seg->SegmentSize, Path);

            SplitPath(Path,Original,TSIZEOF(Original),String,TSIZEOF(String),Ext,TSIZEOF(Ext));
            if (!Original[0])
                OutPath[0] = 0;
            else
            {
                tcscpy_s(OutPath,TSIZEOF(OutPath),Original);
                AddPathDelimiter(OutPath,TSIZEOF(OutPath));
            }
            if (Ext[0])
                stcatprintf_s(OutPath,TSIZEOF(OutPath),T("%s.%zu.%s"),String,j,Ext);
            else
                stcatprintf_s(OutPath,TSIZEOF(OutPath),T("%zu.%s"),j,String);

            Output = StreamOpen(&p,OutPath,SFLAG_WRONLY|SFLAG_CREATE);
            if (!Output)
            {
                Result = OutputError(5,T("Could not open file \"%s\" for writing\r\n"),OutPath);
                goto exit;
            }

            CopyTo(Input, Output, seg->EbmlHeadPos, seg->EbmlSize);
            CopyTo(Input, Output, seg->SegmentPos, seg->SegmentSize);

            StreamClose(Output);
        }
    }

exit:
    ArrayClear(&SegmentStarts);
    if (Input)
        StreamClose(Input);
    if (Output)
        StreamClose(Output);

    // Core-C ending
    ParserContext_Done(&p);

    return Result;
}